

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall pbrt::Tokenizer::~Tokenizer(Tokenizer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Manager_type p_Var3;
  int iVar4;
  FileLoc *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if ((this->unmapPtr != (void *)0x0) && (this->unmapLength != 0)) {
    iVar4 = munmap(this->unmapPtr,this->unmapLength);
    if (iVar4 != 0) {
      LastError();
      ErrorString_abi_cxx11_(0);
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      detail::stringPrintfRecursive<std::__cxx11::string>(&local_50,"munmap: %s",&local_30);
      local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_50._M_dataplus._M_p;
      local_60 = (FileLoc *)0x0;
      if ((this->errorCallback).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(this->errorCallback)._M_invoker)
                ((_Any_data *)&this->errorCallback,(char **)&local_58,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
    }
  }
  pcVar2 = (this->sEscaped)._M_dataplus._M_p;
  paVar1 = &(this->sEscaped).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->contents)._M_dataplus._M_p;
  paVar1 = &(this->contents).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  p_Var3 = (this->errorCallback).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->errorCallback,(_Any_data *)&this->errorCallback,__destroy_functor)
    ;
  }
  return;
}

Assistant:

Tokenizer::~Tokenizer() {
#ifdef PBRT_HAVE_MMAP
    if ((unmapPtr != nullptr) && unmapLength > 0)
        if (munmap(unmapPtr, unmapLength) != 0)
            errorCallback(StringPrintf("munmap: %s", ErrorString()).c_str(), nullptr);
#elif defined(PBRT_IS_WINDOWS)
    if (unmapPtr && UnmapViewOfFile(unmapPtr) == 0)
        errorCallback(StringPrintf("UnmapViewOfFile: %s", ErrorString()).c_str(),
                      nullptr);
#endif
}